

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O3

int lnewwriter(lua_State *L)

{
  undefined4 uVar1;
  size_t __n;
  int iVar2;
  size_t in_RAX;
  void *__dest;
  char *__src;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined4 *puVar5;
  size_t sz;
  size_t local_38;
  
  local_38 = in_RAX;
  iVar2 = lua_isuserdata(L,1);
  if (iVar2 == 0) {
    __src = luaL_checklstring(L,1,&local_38);
    __n = local_38;
    __dest = malloc(local_38);
    memcpy(__dest,__src,__n);
  }
  else {
    __dest = lua_touserdata(L,1);
    local_38 = luaL_checkinteger(L,2);
  }
  puVar3 = (undefined8 *)lua_newuserdata(L,8);
  uVar1 = (undefined4)local_38;
  puVar4 = (undefined8 *)malloc(0x18);
  *puVar4 = 0;
  *(undefined4 *)(puVar4 + 1) = 1;
  puVar5 = (undefined4 *)malloc(0x10);
  *puVar5 = 1;
  puVar5[1] = uVar1;
  *(void **)(puVar5 + 2) = __dest;
  puVar4[2] = puVar5;
  *puVar3 = puVar4;
  lua_pushvalue(L,-0xf4629);
  lua_setmetatable(L,-2);
  return 1;
}

Assistant:

static int
lnewwriter(lua_State *L) {
	void * msg;
	size_t sz;
	if (lua_isuserdata(L,1)) {
		msg = lua_touserdata(L, 1);
		sz = (size_t)luaL_checkinteger(L, 2);
	} else {
		const char * tmp = luaL_checklstring(L,1,&sz);
		msg = skynet_malloc(sz);
		memcpy(msg, tmp, sz);
	}
	struct boxstm * box = lua_newuserdata(L, sizeof(*box));
	box->obj = stm_new(msg,sz);
	lua_pushvalue(L, lua_upvalueindex(1));
	lua_setmetatable(L, -2);

	return 1;
}